

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperationMultiQueueTests.cpp
# Opt level: O1

void __thiscall
vkt::synchronization::anon_unknown_2::BaseTestInstance::BaseTestInstance
          (BaseTestInstance *this,Context *context,ResourceDescription *resourceDesc,
          OperationSupport *writeOp,OperationSupport *readOp,PipelineCacheData *pipelineCacheData)

{
  UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *this_00;
  _Rb_tree_node_base *p_Var1;
  VkDevice device;
  DeviceInterface *vk;
  SimpleAllocator *pSVar2;
  uint uVar3;
  Context *context_00;
  BaseTestInstance *pBVar4;
  InstanceInterface *instanceInterface;
  int i;
  InstanceInterface *pIVar5;
  mapped_type *pmVar6;
  _Rb_tree_node_base *p_Var7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  pointer pbVar9;
  DeviceDriver *this_01;
  SimpleAllocator *this_02;
  OperationContext *this_03;
  ulong uVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_> queueInfos;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
  queueFamilyProperties;
  vector<const_char_*,_std::allocator<const_char_*>_> charDevExtensions;
  float queuePriorities [2];
  VkDeviceCreateInfo deviceInfo;
  VkDeviceQueueCreateInfo queueInfo;
  Move<vk::VkDevice_s_*> local_338;
  VkDeviceQueueCreateInfo *local_318;
  iterator iStack_310;
  VkDeviceQueueCreateInfo *local_308;
  Context *local_300;
  BaseTestInstance *local_2f8;
  VkPhysicalDevice local_2f0;
  InstanceInterface *local_2e8;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> local_2e0;
  char **local_2c8;
  undefined8 uStack_2c0;
  long local_2b8;
  ResourceDescription *local_2a8;
  Resource *local_2a0;
  OperationSupport *local_298;
  PipelineCacheData *local_290;
  undefined8 local_288;
  VkDeviceCreateInfo local_280;
  undefined1 local_238 [16];
  VkAllocationCallbacks *pVStack_228;
  long lStack_220;
  float *local_218;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__BaseTestInstance_00d30608;
  local_2f8 = this;
  local_290 = pipelineCacheData;
  pIVar5 = (InstanceInterface *)operator_new(0x68);
  this_00 = (UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *)(pIVar5 + 3);
  pIVar5[5]._vptr_InstanceInterface = (_func_int **)0x0;
  p_Var1 = (_Rb_tree_node_base *)(pIVar5 + 8);
  *(undefined4 *)&pIVar5[8]._vptr_InstanceInterface = 0;
  pIVar5[9]._vptr_InstanceInterface = (_func_int **)0x0;
  pIVar5->_vptr_InstanceInterface = (_func_int **)0x0;
  pIVar5[1]._vptr_InstanceInterface = (_func_int **)0x0;
  pIVar5[2]._vptr_InstanceInterface = (_func_int **)0x0;
  pIVar5[3]._vptr_InstanceInterface = (_func_int **)0x0;
  pIVar5[10]._vptr_InstanceInterface = (_func_int **)p_Var1;
  pIVar5[0xb]._vptr_InstanceInterface = (_func_int **)p_Var1;
  pIVar5[0xc]._vptr_InstanceInterface = (_func_int **)0x0;
  local_2e8 = Context::getInstanceInterface(context);
  local_300 = context;
  local_2f0 = Context::getPhysicalDevice(context);
  local_2a8 = resourceDesc;
  local_2a0 = (Resource *)writeOp;
  local_298 = readOp;
  ::vk::getPhysicalDeviceQueueFamilyProperties(&local_2e0,local_2e8,local_2f0);
  if (local_2e0.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_2e0.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 0;
    uVar12 = 1;
    do {
      local_280.sType = (int)uVar12 - VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
      uVar3 = local_2e0.
              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar10].queueCount;
      if (1 < local_2e0.
              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar10].queueCount) {
        uVar3 = 2;
      }
      local_238._8_8_ = (void *)0x0;
      pVStack_228 = (VkAllocationCallbacks *)0x0;
      lStack_220 = 0;
      local_238._0_4_ =
           local_2e0.
           super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar10].queueFlags;
      std::vector<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>::resize
                ((vector<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_> *)(local_238 + 8),
                 (ulong)uVar3);
      pmVar6 = std::
               map<unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueData>_>_>
               ::operator[]((map<unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueData>_>_>
                             *)(pIVar5 + 7),&local_280.sType);
      pmVar6->flags = local_238._0_4_;
      std::vector<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>::operator=
                (&pmVar6->queue,
                 (vector<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_> *)(local_238 + 8));
      if ((void *)local_238._8_8_ != (void *)0x0) {
        operator_delete((void *)local_238._8_8_,lStack_220 - local_238._8_8_);
      }
      uVar10 = ((long)local_2e0.
                      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_2e0.
                      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      bVar14 = uVar12 <= uVar10;
      lVar13 = uVar10 - uVar12;
      uVar10 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar14 && lVar13 != 0);
  }
  local_318 = (VkDeviceQueueCreateInfo *)0x0;
  iStack_310._M_current = (VkDeviceQueueCreateInfo *)0x0;
  local_308 = (VkDeviceQueueCreateInfo *)0x0;
  local_288 = 0x3f8000003f800000;
  p_Var7 = (_Rb_tree_node_base *)pIVar5[10]._vptr_InstanceInterface;
  if (p_Var7 != p_Var1) {
    do {
      local_238._0_4_ = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
      local_238._8_8_ = (void *)0x0;
      pVStack_228 = (VkAllocationCallbacks *)((ulong)p_Var7[1]._M_color << 0x20);
      lStack_220 = CONCAT44(lStack_220._4_4_,
                            (int)((ulong)((long)p_Var7[1]._M_right - (long)p_Var7[1]._M_left) >> 3))
      ;
      local_218 = (float *)&local_288;
      if (iStack_310._M_current == local_308) {
        std::vector<vk::VkDeviceQueueCreateInfo,std::allocator<vk::VkDeviceQueueCreateInfo>>::
        _M_realloc_insert<vk::VkDeviceQueueCreateInfo_const&>
                  ((vector<vk::VkDeviceQueueCreateInfo,std::allocator<vk::VkDeviceQueueCreateInfo>>
                    *)&local_318,iStack_310,(VkDeviceQueueCreateInfo *)local_238);
      }
      else {
        (iStack_310._M_current)->pQueuePriorities = (float *)&local_288;
        *(VkAllocationCallbacks **)&(iStack_310._M_current)->flags = pVStack_228;
        *(long *)&(iStack_310._M_current)->queueCount = lStack_220;
        *(undefined8 *)iStack_310._M_current = local_238._0_8_;
        (iStack_310._M_current)->pNext = (void *)0x0;
        iStack_310._M_current = iStack_310._M_current + 1;
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != p_Var1);
  }
  pvVar8 = Context::getDeviceExtensions_abi_cxx11_(local_300);
  local_2c8 = (char **)0x0;
  uStack_2c0 = 0;
  local_2b8 = 0;
  pbVar9 = (pvVar8->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar8->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar9) {
    lVar13 = 0;
    uVar10 = 0;
    do {
      local_238._0_8_ = *(undefined8 *)((long)&(pbVar9->_M_dataplus)._M_p + lVar13);
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_2c8,(char **)local_238);
      uVar10 = uVar10 + 1;
      pbVar9 = (pvVar8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x20;
    } while (uVar10 < (ulong)((long)(pvVar8->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5)
            );
  }
  local_280.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  local_280.pNext = (void *)0x0;
  local_280.flags = 0;
  local_280.queueCreateInfoCount =
       (int)((ulong)((long)iStack_310._M_current - (long)local_318) >> 3) * -0x33333333;
  local_280.pQueueCreateInfos = local_318;
  local_280.enabledLayerCount = 0;
  local_280.ppEnabledLayerNames = (char **)0x0;
  local_280.enabledExtensionCount =
       (deUint32)
       ((ulong)((long)(pvVar8->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar8->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) >> 5);
  local_280.ppEnabledExtensionNames = local_2c8;
  local_280.pEnabledFeatures = Context::getDeviceFeatures(local_300);
  instanceInterface = local_2e8;
  ::vk::createDevice(&local_338,local_2e8,local_2f0,&local_280,(VkAllocationCallbacks *)0x0);
  pVStack_228 = local_338.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator;
  local_238._0_8_ = local_338.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  local_238._8_8_ = local_338.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
  local_338.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice)0x0;
  local_338.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  local_338.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (pIVar5->_vptr_InstanceInterface != (_func_int **)0x0) {
    (*(code *)pIVar5[1]._vptr_InstanceInterface)
              (pIVar5->_vptr_InstanceInterface,pIVar5[2]._vptr_InstanceInterface);
  }
  pIVar5[2]._vptr_InstanceInterface = (_func_int **)pVStack_228;
  pIVar5->_vptr_InstanceInterface = (_func_int **)local_238._0_8_;
  pIVar5[1]._vptr_InstanceInterface = (_func_int **)local_238._8_8_;
  if (local_338.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
    (*local_338.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (local_338.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               local_338.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  this_01 = (DeviceDriver *)operator_new(0x4b8);
  ::vk::DeviceDriver::DeviceDriver
            (this_01,instanceInterface,(VkDevice)pIVar5->_vptr_InstanceInterface);
  local_238._0_8_ = (DeviceDriver *)0x0;
  if ((this_00->m_data).ptr != this_01) {
    de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::reset(this_00)
    ;
    (this_00->m_data).ptr = this_01;
  }
  de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::reset
            ((UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *)local_238);
  this_02 = (SimpleAllocator *)operator_new(0x220);
  device = (VkDevice)pIVar5->_vptr_InstanceInterface;
  vk = (DeviceInterface *)pIVar5[3]._vptr_InstanceInterface;
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)local_238,instanceInterface,local_2f0);
  ::vk::SimpleAllocator::SimpleAllocator
            (this_02,vk,device,(VkPhysicalDeviceMemoryProperties *)local_238);
  pSVar2 = (SimpleAllocator *)pIVar5[5]._vptr_InstanceInterface;
  if (pSVar2 != this_02) {
    if (pSVar2 != (SimpleAllocator *)0x0) {
      (*(pSVar2->super_Allocator)._vptr_Allocator[1])();
      pIVar5[5]._vptr_InstanceInterface = (_func_int **)0x0;
    }
    pIVar5[5]._vptr_InstanceInterface = (_func_int **)this_02;
  }
  for (p_Var7 = (_Rb_tree_node_base *)pIVar5[10]._vptr_InstanceInterface; p_Var7 != p_Var1;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    p_Var11 = p_Var7[1]._M_left;
    if (0 < (int)((ulong)((long)p_Var7[1]._M_right - (long)p_Var11) >> 3)) {
      lVar13 = 0;
      uVar10 = 0;
      do {
        (**(code **)(*pIVar5[3]._vptr_InstanceInterface + 8))
                  (pIVar5[3]._vptr_InstanceInterface,pIVar5->_vptr_InstanceInterface,
                   p_Var7[1]._M_color,uVar10 & 0xffffffff,(long)&p_Var11->_M_color + lVar13);
        uVar10 = uVar10 + 1;
        p_Var11 = p_Var7[1]._M_left;
        lVar13 = lVar13 + 8;
      } while ((long)uVar10 < (long)(int)((ulong)((long)p_Var7[1]._M_right - (long)p_Var11) >> 3));
    }
  }
  if (local_2c8 != (char **)0x0) {
    operator_delete(local_2c8,local_2b8 - (long)local_2c8);
  }
  pBVar4 = local_2f8;
  context_00 = local_300;
  if (local_318 != (VkDeviceQueueCreateInfo *)0x0) {
    operator_delete(local_318,(long)local_308 - (long)local_318);
  }
  if (local_2e0.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.
                    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (pBVar4->m_opContext).m_vki = pIVar5;
  this_03 = (OperationContext *)operator_new(0x40);
  OperationContext::OperationContext
            (this_03,context_00,local_290,(DeviceInterface *)pIVar5[3]._vptr_InstanceInterface,
             (VkDevice)pIVar5->_vptr_InstanceInterface,
             (Allocator *)pIVar5[5]._vptr_InstanceInterface);
  (pBVar4->m_opContext).m_physicalDevice = (VkPhysicalDevice)this_03;
  *(ResourceType *)&(pBVar4->m_opContext).m_allocator = local_2a8->type;
  lVar13 = 0;
  do {
    *(int *)((long)&(pBVar4->m_opContext).m_allocator + lVar13 * 4 + 4) =
         (local_2a8->size).m_data[lVar13];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 4);
  *(VkImageAspectFlags *)((long)&(pBVar4->m_opContext).m_deviceExtensions + 4) =
       local_2a8->imageAspect;
  *(undefined8 *)((long)&(pBVar4->m_opContext).m_pipelineCacheData + 4) =
       *(undefined8 *)&local_2a8->imageType;
  (pBVar4->m_resource).
  super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
  .m_data.ptr = local_2a0;
  *(OperationSupport **)
   &(pBVar4->m_resource).
    super_UniqueBase<vkt::synchronization::Resource,_de::DefaultDeleter<vkt::synchronization::Resource>_>
    .m_data.field_0x8 = local_298;
  return;
}

Assistant:

BaseTestInstance (Context& context, const ResourceDescription& resourceDesc, const OperationSupport& writeOp, const OperationSupport& readOp, PipelineCacheData& pipelineCacheData)
		: TestInstance		(context)
		, m_queues			(new MultiQueues(context))
		, m_opContext		(new OperationContext(context, pipelineCacheData, m_queues->getDeviceInterface(), m_queues->getDevice(), m_queues->getAllocator()))
		, m_resourceDesc	(resourceDesc)
		, m_writeOp			(writeOp)
		, m_readOp			(readOp)
	{
	}